

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O1

int ngram_fwdtree_search(ngram_search_t *ngs,int frame_idx)

{
  uint *puVar1;
  short sVar2;
  s3ssid_t sVar3;
  uint16 uVar4;
  acmod_t *acmod;
  ps_search_t *ppVar5;
  dictword_t *pdVar6;
  chan_t ***pppcVar7;
  last_ltrans_t *plVar8;
  bitvec_t *pbVar9;
  int32 **ppiVar10;
  chan_s *pcVar11;
  dict_t *pdVar12;
  dict2pid_t *pdVar13;
  bin_mdef_t *pbVar14;
  int32 *piVar15;
  s3cipid_t *psVar16;
  bool bVar17;
  chan_s **ppcVar18;
  int32 iVar19;
  int iVar20;
  uint uVar21;
  int32 iVar22;
  int16 *piVar23;
  cand_sf_t *pcVar24;
  int iVar25;
  uint uVar26;
  chan_t **ppcVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  int score;
  int32 *piVar32;
  lastphn_cand_t *plVar33;
  bptbl_t *pbVar34;
  bptbl_t *pbVar35;
  int iVar36;
  int *piVar37;
  chan_t *pcVar38;
  chan_s **ppcVar39;
  chan_t *h;
  long lVar40;
  uint *puVar41;
  uint uVar42;
  long lVar43;
  lastphn_cand_t *plVar44;
  bestbp_rc_t *pbVar45;
  root_chan_t *prVar46;
  int iVar47;
  uint uVar48;
  uint *local_490;
  chan_t **local_480;
  uint local_46c;
  uint *local_468;
  ulong local_460;
  uint *local_458;
  ulong local_450;
  uint *local_448;
  ulong local_440;
  int32 local_438 [258];
  
  acmod = (ngs->base).acmod;
  local_46c = frame_idx;
  if (acmod->compallsen == '\0') {
    acmod_clear_active(acmod);
    if (0 < ngs->n_root_chan) {
      prVar46 = ngs->root_chan;
      iVar47 = ngs->n_root_chan + 1;
      do {
        if ((prVar46->hmm).frame == frame_idx) {
          acmod_activate_hmm((ngs->base).acmod,&prVar46->hmm);
        }
        prVar46 = prVar46 + 1;
        iVar47 = iVar47 + -1;
      } while (1 < iVar47);
    }
    uVar42 = frame_idx & 1;
    if (0 < ngs->n_active_chan[uVar42]) {
      ppcVar27 = ngs->active_chan_list[uVar42];
      iVar47 = ngs->n_active_chan[uVar42] + 1;
      do {
        pcVar38 = *ppcVar27;
        ppcVar27 = ppcVar27 + 1;
        acmod_activate_hmm((ngs->base).acmod,&pcVar38->hmm);
        iVar47 = iVar47 + -1;
      } while (1 < iVar47);
    }
    if (0 < ngs->n_active_word[uVar42]) {
      piVar37 = ngs->active_word_list[uVar42];
      iVar47 = ngs->n_active_word[uVar42];
      do {
        for (pcVar38 = ngs->word_chan[*piVar37]; pcVar38 != (chan_t *)0x0; pcVar38 = pcVar38->next)
        {
          acmod_activate_hmm((ngs->base).acmod,&pcVar38->hmm);
        }
        piVar37 = piVar37 + 1;
        bVar17 = 1 < iVar47;
        iVar47 = iVar47 + -1;
      } while (bVar17);
    }
    if (0 < ngs->n_1ph_words) {
      lVar43 = 0;
      do {
        if ((ngs->word_chan[ngs->single_phone_wid[lVar43]]->hmm).frame == frame_idx) {
          acmod_activate_hmm((ngs->base).acmod,&ngs->word_chan[ngs->single_phone_wid[lVar43]]->hmm);
        }
        lVar43 = lVar43 + 1;
      } while (lVar43 < ngs->n_1ph_words);
    }
  }
  piVar23 = acmod_score((ngs->base).acmod,(int *)&local_46c);
  iVar47 = 0;
  if (piVar23 != (int16 *)0x0) {
    piVar32 = &(ngs->st).n_senone_active_utt;
    *piVar32 = *piVar32 + ((ngs->base).acmod)->n_senone_active;
    ngram_search_mark_bptable(ngs,local_46c);
    iVar47 = 0;
    if (-0x20000000 < ngs->best_score) {
      if (ngs->best_score + ngs->beam * 2 < -0x20000000) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                ,0x5c5,"Renormalizing Scores at frame %d, best score %d\n",(ulong)local_46c);
        uVar42 = local_46c;
        iVar19 = ngs->best_score;
        if (0 < ngs->n_root_chan) {
          prVar46 = ngs->root_chan;
          iVar47 = ngs->n_root_chan + 1;
          do {
            if ((prVar46->hmm).frame == uVar42) {
              hmm_normalize(&prVar46->hmm,iVar19);
            }
            prVar46 = prVar46 + 1;
            iVar47 = iVar47 + -1;
          } while (1 < iVar47);
        }
        uVar48 = uVar42 & 1;
        if (0 < ngs->n_active_chan[uVar48]) {
          ppcVar27 = ngs->active_chan_list[uVar48];
          iVar47 = ngs->n_active_chan[uVar48] + 1;
          do {
            pcVar38 = *ppcVar27;
            ppcVar27 = ppcVar27 + 1;
            hmm_normalize(&pcVar38->hmm,iVar19);
            iVar47 = iVar47 + -1;
          } while (1 < iVar47);
        }
        if (0 < ngs->n_active_word[uVar48]) {
          piVar37 = ngs->active_word_list[uVar48];
          iVar47 = ngs->n_active_word[uVar48];
          do {
            for (pcVar38 = ngs->word_chan[*piVar37]; pcVar38 != (chan_t *)0x0;
                pcVar38 = pcVar38->next) {
              hmm_normalize(&pcVar38->hmm,iVar19);
            }
            piVar37 = piVar37 + 1;
            bVar17 = 1 < iVar47;
            iVar47 = iVar47 + -1;
          } while (bVar17);
        }
        if (0 < ngs->n_1ph_words) {
          lVar43 = 0;
          do {
            if ((ngs->word_chan[ngs->single_phone_wid[lVar43]]->hmm).frame == uVar42) {
              hmm_normalize(&ngs->word_chan[ngs->single_phone_wid[lVar43]]->hmm,iVar19);
            }
            lVar43 = lVar43 + 1;
          } while (lVar43 < ngs->n_1ph_words);
        }
        ngs->renormalized = 1;
      }
      uVar42 = local_46c;
      ngs->hmmctx->senscore = piVar23;
      iVar30 = -0x20000000;
      iVar47 = -0x20000000;
      if (0 < ngs->n_root_chan) {
        prVar46 = ngs->root_chan;
        iVar36 = ngs->n_root_chan + 1;
        do {
          if ((prVar46->hmm).frame == uVar42) {
            iVar19 = hmm_vit_eval(&prVar46->hmm);
            if (iVar47 < iVar19) {
              iVar47 = iVar19;
            }
            piVar32 = &(ngs->st).n_root_chan_eval;
            *piVar32 = *piVar32 + 1;
          }
          prVar46 = prVar46 + 1;
          iVar36 = iVar36 + -1;
        } while (1 < iVar36);
      }
      ngs->best_score = iVar47;
      uVar48 = uVar42 & 1;
      iVar47 = ngs->n_active_chan[uVar48];
      ppcVar27 = ngs->active_chan_list[uVar48];
      piVar32 = &(ngs->st).n_nonroot_chan_eval;
      *piVar32 = *piVar32 + iVar47;
      if (0 < iVar47) {
        iVar47 = iVar47 + 1;
        iVar30 = -0x20000000;
        do {
          pcVar38 = *ppcVar27;
          iVar19 = hmm_vit_eval(&pcVar38->hmm);
          if ((pcVar38->hmm).frame != uVar42) {
            __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x27c,"int32 eval_nonroot_chan(ngram_search_t *, int)");
          }
          ppcVar27 = ppcVar27 + 1;
          if (iVar30 < iVar19) {
            iVar30 = iVar19;
          }
          iVar47 = iVar47 + -1;
        } while (1 < iVar47);
      }
      if (ngs->best_score < iVar30) {
        ngs->best_score = iVar30;
      }
      if (ngs->n_active_word[uVar48] < 1) {
        iVar47 = -0x20000000;
        iVar30 = 0;
      }
      else {
        local_490 = (uint *)ngs->active_word_list[uVar48];
        iVar47 = -0x20000000;
        iVar30 = 0;
        iVar36 = ngs->n_active_word[uVar48];
        do {
          uVar21 = *local_490;
          uVar28 = uVar21 + 0x1f;
          if (-1 < (long)(int)uVar21) {
            uVar28 = uVar21;
          }
          uVar26 = ngs->word_active[(int)uVar28 >> 5];
          if ((uVar26 >> (uVar21 & 0x1f) & 1) == 0) {
            __assert_fail("bitvec_is_set(ngs->word_active, w)",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x291,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          ngs->word_active[(int)uVar28 >> 5] = uVar26 & ~(uint)(1L << ((byte)uVar21 & 0x1f));
          pcVar38 = ngs->word_chan[(int)uVar21];
          if (pcVar38 == (chan_t *)0x0) {
            __assert_fail("ngs->word_chan[w] != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x293,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          local_490 = local_490 + 1;
          do {
            if ((pcVar38->hmm).frame != uVar42) {
              __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x298,"int32 eval_word_chan(ngram_search_t *, int)");
            }
            iVar19 = hmm_vit_eval(&pcVar38->hmm);
            if (iVar47 < iVar19) {
              iVar47 = iVar19;
            }
            iVar30 = iVar30 + 1;
            pcVar38 = pcVar38->next;
          } while (pcVar38 != (chan_s *)0x0);
          bVar17 = 1 < iVar36;
          iVar36 = iVar36 + -1;
        } while (bVar17);
      }
      if (ngs->n_1ph_words < 1) {
        iVar36 = 0;
      }
      else {
        lVar43 = 0;
        iVar36 = 0;
        do {
          iVar25 = ngs->single_phone_wid[lVar43];
          if ((int)uVar42 <= (ngs->word_chan[iVar25]->hmm).frame) {
            iVar19 = hmm_vit_eval(&ngs->word_chan[iVar25]->hmm);
            if ((iVar47 < iVar19) && (iVar25 != (ngs->base).finish_wid)) {
              iVar47 = iVar19;
            }
            iVar36 = iVar36 + 1;
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 < ngs->n_1ph_words);
      }
      uVar42 = local_46c;
      piVar32 = &(ngs->st).n_last_chan_eval;
      *piVar32 = *piVar32 + iVar30 + iVar36;
      iVar30 = iVar30 + iVar36 + (ngs->st).n_nonroot_chan_eval;
      (ngs->st).n_nonroot_chan_eval = iVar30;
      piVar32 = &(ngs->st).n_word_lastchan_eval;
      *piVar32 = *piVar32 + iVar36 + ngs->n_active_word[uVar48];
      if (ngs->best_score < iVar47) {
        ngs->best_score = iVar47;
      }
      ngs->last_phone_best_score = iVar47;
      ngs->n_lastphn_cand = 0;
      iVar47 = ngs->beam;
      iVar36 = ngs->maxhmmpf;
      ngs->dynamic_beam = iVar47;
      if ((iVar36 != -1) && (iVar36 < iVar30 + (ngs->st).n_root_chan_eval)) {
        iVar30 = iVar47 + 0xff;
        if (-1 < iVar47) {
          iVar30 = iVar47;
        }
        iVar30 = -(iVar30 >> 8);
        memset(local_438,0,0x400);
        iVar47 = ngs->n_root_chan;
        if (0 < iVar47) {
          iVar25 = ngs->best_score;
          piVar32 = &(ngs->root_chan->hmm).bestscore;
          do {
            iVar20 = (iVar25 - *piVar32) / iVar30;
            if (0xfe < iVar20) {
              iVar20 = 0xff;
            }
            local_438[iVar20] = local_438[iVar20] + 1;
            piVar32 = piVar32 + 0x1c;
            iVar47 = iVar47 + -1;
          } while (iVar47 != 0);
        }
        if (0 < ngs->n_active_chan[uVar42 & 1]) {
          ppcVar27 = ngs->active_chan_list[uVar42 & 1];
          iVar47 = ngs->best_score;
          iVar25 = ngs->n_active_chan[uVar42 & 1] + 1;
          do {
            iVar20 = (iVar47 - ((*ppcVar27)->hmm).bestscore) / iVar30;
            if (0xfe < iVar20) {
              iVar20 = 0xff;
            }
            local_438[iVar20] = local_438[iVar20] + 1;
            ppcVar27 = ppcVar27 + 1;
            iVar25 = iVar25 + -1;
          } while (1 < iVar25);
        }
        lVar43 = 0;
        iVar47 = 0;
        do {
          iVar47 = iVar47 + local_438[lVar43];
          if (iVar36 < iVar47) goto LAB_0013aaac;
          lVar43 = lVar43 + 1;
        } while (lVar43 != 0x100);
        lVar43 = 0x100;
LAB_0013aaac:
        ngs->dynamic_beam = -(iVar30 * (int)lVar43);
      }
      uVar48 = uVar42 + 1;
      local_450 = (ulong)(uVar48 & 1);
      ppcVar27 = ngs->active_chan_list[local_450];
      if (0 < ngs->n_root_chan) {
        iVar47 = ngs->best_score;
        iVar30 = ngs->dynamic_beam + iVar47;
        iVar36 = ngs->pbeam + iVar47;
        ppVar5 = (ngs->base).pls;
        prVar46 = ngs->root_chan;
        iVar25 = 0;
        local_460 = CONCAT44(local_460._4_4_,iVar47 + ngs->lpbeam);
        local_468 = (uint *)CONCAT44(local_468._4_4_,iVar30);
        do {
          if (((int)uVar42 <= (prVar46->hmm).frame) && (iVar30 < (prVar46->hmm).bestscore)) {
            (prVar46->hmm).frame = uVar48;
            iVar47 = ngs->pip + (prVar46->hmm).out_score;
            if ((ppVar5 != (ps_search_t *)0x0) || (iVar36 < iVar47)) {
              for (pcVar38 = prVar46->next; pcVar38 != (chan_t *)0x0; pcVar38 = pcVar38->alt) {
                if (ppVar5 == (ps_search_t *)0x0) {
                  iVar30 = 0;
                }
                else {
                  iVar30 = *(int *)((long)&(ppVar5[1].acmod)->config + (long)pcVar38->ciphone * 4);
                }
                if ((iVar36 < iVar30 + iVar47) &&
                   (((pcVar38->hmm).frame < (int)uVar42 || ((pcVar38->hmm).score[0] < iVar47)))) {
                  hmm_enter(&pcVar38->hmm,iVar47,(prVar46->hmm).out_history,uVar48);
                  *ppcVar27 = pcVar38;
                  ppcVar27 = ppcVar27 + 1;
                }
              }
            }
            iVar30 = (int)local_468;
            if (((ppVar5 != (ps_search_t *)0x0) || ((int)local_460 < iVar47)) &&
               (uVar21 = prVar46->penult_phn_wid, -1 < (int)uVar21)) {
              piVar32 = ngs->homophone_set;
              do {
                if (ppVar5 == (ps_search_t *)0x0) {
                  iVar20 = 0;
                }
                else {
                  pdVar6 = ((ngs->base).dict)->word;
                  iVar20 = *(int *)((long)&(ppVar5[1].acmod)->config +
                                   (long)pdVar6[uVar21].ciphone[(long)pdVar6[uVar21].pronlen + -1] *
                                   4);
                }
                if ((int)local_460 < iVar20 + iVar47) {
                  plVar44 = ngs->lastphn_cand;
                  iVar20 = ngs->n_lastphn_cand;
                  ngs->n_lastphn_cand = iVar20 + 1;
                  plVar44[iVar20].wid = uVar21;
                  plVar44[iVar20].score = iVar47 - ngs->nwpen;
                  plVar44[iVar20].bp = (prVar46->hmm).out_history;
                }
                uVar21 = piVar32[uVar21];
              } while (-1 < (int)uVar21);
            }
          }
          iVar25 = iVar25 + 1;
          prVar46 = prVar46 + 1;
        } while (iVar25 < ngs->n_root_chan);
      }
      pppcVar7 = ngs->active_chan_list;
      local_480 = pppcVar7[local_450];
      iVar47 = (int)((ulong)((long)ppcVar27 - (long)local_480) >> 3);
      ngs->n_active_chan[local_450] = iVar47;
      local_440 = (ulong)(uVar42 & 1);
      local_480 = local_480 + iVar47;
      uVar21 = ngs->n_active_chan[local_440];
      if (0 < (int)uVar21) {
        iVar47 = ngs->best_score;
        local_460 = CONCAT44(local_460._4_4_,ngs->dynamic_beam + iVar47);
        iVar30 = ngs->pbeam + iVar47;
        ppcVar27 = pppcVar7[local_440];
        ppVar5 = (ngs->base).pls;
        local_458 = (uint *)CONCAT44(local_458._4_4_,iVar47 + ngs->lpbeam);
        do {
          puVar41 = (uint *)(ulong)uVar21;
          pcVar38 = *ppcVar27;
          uVar21 = (pcVar38->hmm).frame;
          if ((int)uVar21 < (int)uVar42) {
            __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x335,"void prune_nonroot_chan(ngram_search_t *, int)");
          }
          if ((int)local_460 < (pcVar38->hmm).bestscore) {
            if (uVar21 != uVar48) {
              (pcVar38->hmm).frame = uVar48;
              *local_480 = pcVar38;
              local_480 = local_480 + 1;
            }
            iVar47 = ngs->pip + (pcVar38->hmm).out_score;
            local_468 = puVar41;
            if ((ppVar5 != (ps_search_t *)0x0) || (iVar30 < iVar47)) {
              for (h = pcVar38->next; h != (chan_t *)0x0; h = h->alt) {
                if (ppVar5 == (ps_search_t *)0x0) {
                  iVar36 = 0;
                }
                else {
                  iVar36 = *(int *)((long)&(ppVar5[1].acmod)->config + (long)h->ciphone * 4);
                }
                if ((iVar30 < iVar36 + iVar47) &&
                   ((uVar21 = (h->hmm).frame, (int)uVar21 < (int)uVar42 ||
                    ((h->hmm).score[0] < iVar47)))) {
                  if (uVar21 != uVar48) {
                    *local_480 = h;
                    local_480 = local_480 + 1;
                  }
                  hmm_enter(&h->hmm,iVar47,(pcVar38->hmm).out_history,uVar48);
                }
              }
            }
            puVar41 = local_468;
            if (((ppVar5 != (ps_search_t *)0x0) || ((int)local_458 < iVar47)) &&
               (uVar21 = (pcVar38->info).penult_phn_wid, -1 < (int)uVar21)) {
              piVar32 = ngs->homophone_set;
              do {
                if (ppVar5 == (ps_search_t *)0x0) {
                  iVar36 = 0;
                }
                else {
                  pdVar6 = ((ngs->base).dict)->word;
                  iVar36 = *(int *)((long)&(ppVar5[1].acmod)->config +
                                   (long)pdVar6[uVar21].ciphone[(long)pdVar6[uVar21].pronlen + -1] *
                                   4);
                }
                if ((int)local_458 < iVar36 + iVar47) {
                  plVar44 = ngs->lastphn_cand;
                  iVar36 = ngs->n_lastphn_cand;
                  ngs->n_lastphn_cand = iVar36 + 1;
                  plVar44[iVar36].wid = uVar21;
                  plVar44[iVar36].score = iVar47 - ngs->nwpen;
                  plVar44[iVar36].bp = (pcVar38->hmm).out_history;
                }
                uVar21 = piVar32[uVar21];
              } while (-1 < (int)uVar21);
            }
          }
          else if (uVar21 != uVar48) {
            hmm_clear(&pcVar38->hmm);
          }
          ppcVar27 = ppcVar27 + 1;
          uVar21 = (int)puVar41 - 1;
        } while (1 < (int)puVar41);
      }
      uVar29 = (ulong)(uint)((int)local_450 * 8);
      ngs->n_active_chan[local_450] =
           (int32)((ulong)((long)local_480 - *(long *)((long)ngs->active_chan_list + uVar29)) >> 3);
      local_468 = *(uint **)((long)ngs->active_word_list + uVar29);
      iVar47 = ngs->n_lastphn_cand;
      piVar32 = &(ngs->st).n_lastphn_cand_utt;
      *piVar32 = *piVar32 + iVar47;
      if (iVar47 < 1) {
        uVar21 = 0;
      }
      else {
        plVar44 = ngs->lastphn_cand;
        iVar47 = 0;
        uVar21 = 0;
        do {
          if ((long)plVar44->bp != -1) {
            pbVar34 = ngs->bp_table + plVar44->bp;
            iVar19 = ngram_search_exit_score
                               (ngs,pbVar34,(int)*((ngs->base).dict)->word[plVar44->wid].ciphone);
            if (iVar19 < -0x1fffffff) {
              __assert_fail("start_score BETTER_THAN WORST_SCORE",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x392,"void last_phone_transition(ngram_search_t *, int)");
            }
            plVar44->score = plVar44->score - iVar19;
            if (ngs->last_ltrans[plVar44->wid].sf != pbVar34->frame + 1) {
              if (0 < (int)uVar21) {
                uVar29 = 0;
                do {
                  if (ngs->cand_sf[uVar29].bp_ef == pbVar34->frame) {
                    plVar44->next = ngs->cand_sf[uVar29].cand;
                    uVar28 = (uint)uVar29;
                    goto LAB_0013b055;
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar21 != uVar29);
              }
              iVar30 = ngs->cand_sf_alloc;
              if (iVar30 <= (int)uVar21) {
                if (iVar30 == 0) {
                  pcVar24 = (cand_sf_t *)
                            __ckd_calloc__(0x20,8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                           ,0x3ab);
                  ngs->cand_sf = pcVar24;
                  ngs->cand_sf_alloc = 0x20;
                }
                else {
                  ngs->cand_sf_alloc = iVar30 + 0x20;
                  pcVar24 = (cand_sf_t *)
                            __ckd_realloc__(ngs->cand_sf,(long)iVar30 * 8 + 0x100,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                            ,0x3b2);
                  ngs->cand_sf = pcVar24;
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x3b4,"cand_sf[] increased to %d entries\n",
                          (ulong)(uint)ngs->cand_sf_alloc);
                }
              }
              plVar44->next = -1;
              ngs->cand_sf[(int)uVar21].bp_ef = pbVar34->frame;
              uVar28 = uVar21;
              uVar21 = uVar21 + 1;
LAB_0013b055:
              ngs->cand_sf[(int)uVar28].cand = iVar47;
              plVar8 = ngs->last_ltrans;
              iVar30 = plVar44->wid;
              plVar8[iVar30].dscr = -0x20000000;
              plVar8[iVar30].sf = pbVar34->frame + 1;
            }
          }
          iVar47 = iVar47 + 1;
          plVar44 = plVar44 + 1;
        } while (iVar47 < ngs->n_lastphn_cand);
      }
      if (0 < (int)uVar21) {
        local_460 = (ulong)uVar21;
        uVar29 = 0;
        do {
          lVar43 = (long)ngs->cand_sf[uVar29].bp_ef;
          iVar47 = ngs->bp_table_idx[lVar43];
          iVar30 = ngs->bp_table_idx[lVar43 + 1];
          if (iVar47 < iVar30) {
            pbVar34 = ngs->bp_table + iVar47;
            do {
              if (pbVar34->valid != '\0') {
                uVar21 = ngs->cand_sf[uVar29].cand;
                while (-1 < (int)uVar21) {
                  plVar44 = ngs->lastphn_cand + uVar21;
                  iVar19 = ngram_search_exit_score
                                     (ngs,pbVar34,
                                      (int)*((ngs->base).dict)->word[ngs->lastphn_cand[uVar21].wid].
                                            ciphone);
                  if (-0x20000000 < iVar19) {
                    iVar36 = dict_filler_word((ngs->base).dict,plVar44->wid);
                    if (iVar36 != 0) {
                      __assert_fail("!dict_filler_word(ps_search_dict(ngs), candp->wid)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                    ,0x3d5,"void last_phone_transition(ngram_search_t *, int)");
                    }
                    iVar22 = ngram_tg_score(ngs->lmset,
                                            ((ngs->base).dict)->word[plVar44->wid].basewid,
                                            pbVar34->real_wid,pbVar34->prev_real_wid,local_438);
                    iVar19 = iVar19 + (iVar22 >> 10);
                  }
                  plVar8 = ngs->last_ltrans;
                  iVar36 = plVar44->wid;
                  if (plVar8[iVar36].dscr < iVar19) {
                    plVar8[iVar36].dscr = iVar19;
                    plVar8[iVar36].bp = iVar47;
                  }
                  uVar21 = plVar44->next;
                }
              }
              iVar47 = iVar47 + 1;
              pbVar34 = pbVar34 + 1;
            } while (iVar47 != iVar30);
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 != local_460);
      }
      iVar47 = ngs->last_phone_best_score;
      plVar44 = ngs->lastphn_cand;
      iVar30 = ngs->n_lastphn_cand;
      if (0 < iVar30) {
        plVar8 = ngs->last_ltrans;
        plVar33 = plVar44;
        iVar36 = iVar30;
        do {
          iVar25 = plVar33->score + plVar8[plVar33->wid].dscr;
          plVar33->score = iVar25;
          plVar33->bp = plVar8[plVar33->wid].bp;
          if (iVar47 < iVar25) {
            iVar47 = iVar25;
          }
          plVar33 = plVar33 + 1;
          iVar36 = iVar36 + -1;
        } while (iVar36 != 0);
      }
      iVar36 = ngs->lponlybeam;
      ngs->last_phone_best_score = iVar47;
      if (0 < iVar30) {
        do {
          if (iVar36 + iVar47 < plVar44->score) {
            uVar21 = plVar44->wid;
            ngram_search_alloc_all_rc(ngs,uVar21);
            pcVar38 = ngs->word_chan[(int)uVar21];
            if (pcVar38 != (chan_t *)0x0) {
              iVar25 = 0;
              do {
                uVar28 = (pcVar38->hmm).frame;
                if (((int)uVar28 < (int)uVar42) || ((pcVar38->hmm).score[0] < plVar44->score)) {
                  if (uVar28 == uVar48) {
                    __assert_fail("hmm_frame(&hmm->hmm) != nf",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x3fc,"void last_phone_transition(ngram_search_t *, int)");
                  }
                  hmm_enter(&pcVar38->hmm,plVar44->score,plVar44->bp,uVar48);
                  iVar25 = iVar25 + 1;
                }
                pcVar38 = pcVar38->next;
              } while (pcVar38 != (chan_s *)0x0);
              if (0 < iVar25) {
                uVar28 = uVar21 + 0x1f;
                if (-1 < (int)uVar21) {
                  uVar28 = uVar21;
                }
                pbVar9 = ngs->word_active;
                if ((pbVar9[(int)uVar28 >> 5] >> (uVar21 & 0x1f) & 1) != 0) {
                  __assert_fail("bitvec_is_clear(ngs->word_active, w)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x403,"void last_phone_transition(ngram_search_t *, int)");
                }
                if (((ngs->base).dict)->word[(int)uVar21].pronlen == 1) {
                  __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x404,"void last_phone_transition(ngram_search_t *, int)");
                }
                *local_468 = uVar21;
                local_468 = local_468 + 1;
                puVar41 = pbVar9 + ((int)uVar28 >> 5);
                *puVar41 = *puVar41 | (uint)(1L << ((byte)uVar21 & 0x1f));
              }
            }
          }
          plVar44 = plVar44 + 1;
          bVar17 = 1 < iVar30;
          iVar30 = iVar30 + -1;
        } while (bVar17);
      }
      ppiVar10 = ngs->active_word_list;
      piVar32 = ppiVar10[local_450];
      iVar30 = (int)((ulong)((long)local_468 - (long)piVar32) >> 2);
      ngs->n_active_word[local_450] = iVar30;
      iVar47 = ngs->wbeam + ngs->last_phone_best_score;
      iVar36 = ngs->last_phone_best_score + ngs->lponlybeam;
      local_448 = (uint *)(piVar32 + iVar30);
      uVar21 = ngs->n_active_word[local_440];
      if (0 < (int)uVar21) {
        puVar41 = (uint *)ppiVar10[local_440];
        do {
          uVar29 = (ulong)(int)*puVar41;
          pcVar38 = ngs->word_chan[uVar29];
          uVar28 = uVar21;
          if (pcVar38 != (chan_t *)0x0) {
            ppcVar39 = ngs->word_chan + uVar29;
            iVar30 = 0;
            local_468 = (uint *)(ulong)uVar21;
            local_460 = (ulong)*puVar41;
            local_458 = puVar41;
            local_440 = uVar29;
            do {
              uVar21 = (pcVar38->hmm).frame;
              if ((int)uVar21 < (int)uVar42) {
                __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                              ,0x428,"void prune_word_chan(ngram_search_t *, int)");
              }
              ppcVar18 = &pcVar38->next;
              pcVar11 = pcVar38->next;
              if (iVar36 < (pcVar38->hmm).bestscore) {
                (pcVar38->hmm).frame = uVar48;
                iVar30 = iVar30 + 1;
                iVar19 = (pcVar38->hmm).out_score;
                if (iVar47 < iVar19) {
                  ngram_search_save_bp
                            (ngs,uVar42,(int32)local_460,iVar19,(pcVar38->hmm).out_history,
                             (pcVar38->info).penult_phn_wid);
                }
              }
              else if (uVar21 != uVar48) {
                hmm_deinit(&pcVar38->hmm);
                __listelem_free__(ngs->chan_alloc,pcVar38,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x43f);
                *ppcVar39 = pcVar11;
                ppcVar18 = ppcVar39;
              }
              ppcVar39 = ppcVar18;
              pcVar38 = pcVar11;
            } while (pcVar11 != (chan_s *)0x0);
            uVar28 = (uint)local_468;
            puVar41 = local_458;
            if (0 < iVar30) {
              uVar21 = (uint)local_460;
              uVar26 = uVar21 + 0x1f;
              if (-1 < (int)uVar21) {
                uVar26 = uVar21;
              }
              pbVar9 = ngs->word_active;
              if ((pbVar9[(int)uVar26 >> 5] >> (uVar21 & 0x1f) & 1) == 0) {
                if (((ngs->base).dict)->word[local_440].pronlen == 1) {
                  __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x444,"void prune_word_chan(ngram_search_t *, int)");
                }
                *local_448 = uVar21;
                local_448 = local_448 + 1;
                puVar1 = pbVar9 + ((int)uVar26 >> 5);
                *puVar1 = *puVar1 | (uint)(1L << ((byte)local_460 & 0x1f));
              }
            }
          }
          puVar41 = puVar41 + 1;
          uVar21 = uVar28 - 1;
        } while (1 < (int)uVar28);
      }
      ngs->n_active_word[local_450] =
           (int32)((ulong)((long)local_448 - (long)ngs->active_word_list[local_450]) >> 2);
      if (0 < ngs->n_1ph_words) {
        lVar43 = 0;
        do {
          iVar30 = ngs->single_phone_wid[lVar43];
          pcVar38 = ngs->word_chan[iVar30];
          if (((int)uVar42 <= (pcVar38->hmm).frame) && (iVar36 < (pcVar38->hmm).bestscore)) {
            (pcVar38->hmm).frame = uVar48;
            iVar25 = (pcVar38->hmm).out_score;
            if (iVar47 < iVar25) {
              ngram_search_save_bp(ngs,uVar42,iVar30,iVar25,(pcVar38->hmm).out_history,0);
            }
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 < ngs->n_1ph_words);
      }
      if ((ngs->maxwpf != -1) && (ngs->maxwpf != (ngs->base).n_words)) {
        lVar43 = (long)(int)local_46c;
        lVar40 = (long)ngs->bp_table_idx[lVar43];
        iVar47 = ngs->bpidx;
        if (ngs->bp_table_idx[lVar43] < iVar47) {
          lVar31 = lVar40 * 0x24;
          local_490 = (uint *)0x0;
          iVar36 = -0x80000000;
          iVar30 = 0;
          do {
            pbVar34 = ngs->bp_table;
            iVar47 = dict_filler_word((ngs->base).dict,*(s3wid_t *)((long)&pbVar34->wid + lVar31));
            if (iVar47 != 0) {
              iVar47 = *(int *)((long)&pbVar34->score + lVar31);
              if (iVar36 < iVar47) {
                local_490 = (uint *)((long)&pbVar34->frame + lVar31);
                iVar36 = iVar47;
              }
              (&pbVar34->valid)[lVar31] = '\0';
              iVar30 = iVar30 + 1;
            }
            lVar40 = lVar40 + 1;
            iVar47 = ngs->bpidx;
            lVar31 = lVar31 + 0x24;
          } while (lVar40 < iVar47);
        }
        else {
          iVar30 = 0;
          local_490 = (uint *)0x0;
        }
        if (local_490 != (uint *)0x0) {
          *(undefined1 *)((long)local_490 + 4) = 1;
          iVar30 = iVar30 + -1;
        }
        iVar36 = ngs->bp_table_idx[lVar43];
        iVar30 = (iVar47 - iVar36) - iVar30;
        iVar25 = ngs->maxwpf;
        if (iVar25 < iVar30) {
          do {
            if (iVar36 < iVar47) {
              pbVar35 = ngs->bp_table + iVar36;
              iVar20 = 0x7fffffff;
              pbVar34 = (bptbl_t *)0x0;
              lVar43 = (long)iVar47 - (long)iVar36;
              do {
                if ((pbVar35->valid != '\0') && (pbVar35->score < iVar20)) {
                  pbVar34 = pbVar35;
                  iVar20 = pbVar35->score;
                }
                pbVar35 = pbVar35 + 1;
                lVar43 = lVar43 + -1;
              } while (lVar43 != 0);
            }
            else {
              pbVar34 = (bptbl_t *)0x0;
            }
            if (pbVar34 == (bptbl_t *)0x0) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                      ,0x4d3,"PANIC: No worst BPtable entry remaining\n");
              exit(1);
            }
            pbVar34->valid = '\0';
            iVar30 = iVar30 + -1;
          } while (iVar25 < iVar30);
        }
      }
      uVar42 = local_46c;
      puVar41 = (uint *)(long)(int)local_46c;
      pdVar12 = (ngs->base).dict;
      pdVar13 = (ngs->base).d2p;
      pbVar14 = ((ngs->base).acmod)->mdef;
      lVar43 = (long)pbVar14->n_ciphone;
      if (0 < lVar43) {
        lVar40 = lVar43 + 1;
        pbVar45 = ngs->bestbp_rc + lVar43;
        do {
          pbVar45 = pbVar45 + -1;
          pbVar45->score = -0x20000000;
          lVar40 = lVar40 + -1;
        } while (1 < lVar40);
      }
      lVar43 = (long)ngs->bp_table_idx[(long)puVar41];
      if (ngs->bp_table_idx[(long)puVar41] < ngs->bpidx) {
        ppVar5 = (ngs->base).pls;
        pbVar34 = ngs->bp_table;
        piVar32 = ngs->word_lat_idx;
        iVar47 = 0;
        do {
          piVar32[pbVar34[lVar43].wid] = -1;
          if (pbVar34[lVar43].wid != (ngs->base).finish_wid) {
            iVar47 = iVar47 + 1;
            if ((long)pbVar34[lVar43].last2_phone == -1) {
              iVar30 = pbVar14->n_ciphone;
              if (0 < (long)iVar30) {
                iVar36 = pbVar34[lVar43].score;
                pbVar45 = ngs->bestbp_rc;
                lVar40 = 0;
                do {
                  if (*(int *)((long)&pbVar45->score + lVar40) < iVar36) {
                    *(int *)((long)&pbVar45->score + lVar40) = iVar36;
                    *(int32 *)((long)&pbVar45->path + lVar40) = (int32)lVar43;
                    *(int *)((long)&pbVar45->lc + lVar40) = (int)pbVar34[lVar43].last_phone;
                  }
                  lVar40 = lVar40 + 0xc;
                } while ((long)iVar30 * 0xc != lVar40);
              }
            }
            else {
              iVar30 = pbVar14->n_ciphone;
              if (0 < (long)iVar30) {
                iVar36 = pbVar34[lVar43].s_idx;
                piVar15 = ngs->bscore_stack;
                sVar2 = pbVar34[lVar43].last_phone;
                psVar16 = pdVar13->rssid[(int)sVar2][pbVar34[lVar43].last2_phone].cimap;
                pbVar45 = ngs->bestbp_rc;
                lVar40 = 0;
                do {
                  if (pbVar45->score < piVar15[(long)iVar36 + (long)psVar16[lVar40]]) {
                    pbVar45->score = piVar15[(long)iVar36 + (long)psVar16[lVar40]];
                    pbVar45->path = (int32)lVar43;
                    pbVar45->lc = (int)sVar2;
                  }
                  lVar40 = lVar40 + 1;
                  pbVar45 = pbVar45 + 1;
                } while (iVar30 != lVar40);
              }
            }
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 < ngs->bpidx);
        if (iVar47 != 0) {
          iVar30 = local_46c + 1;
          iVar47 = ngs->dynamic_beam + ngs->best_score;
          local_460 = CONCAT44(local_460._4_4_,iVar47);
          if (0 < ngs->n_root_chan) {
            prVar46 = ngs->root_chan;
            iVar36 = ngs->n_root_chan + 1;
            do {
              lVar43 = (long)prVar46->ciphone;
              if (ppVar5 == (ps_search_t *)0x0) {
                iVar25 = 0;
              }
              else {
                iVar25 = *(int *)((long)&(ppVar5[1].acmod)->config + lVar43 * 4);
              }
              pbVar45 = ngs->bestbp_rc;
              iVar20 = ngs->nwpen + pbVar45[lVar43].score + ngs->pip;
              if ((iVar47 < iVar25 + iVar20) &&
                 (((prVar46->hmm).frame < (int)uVar42 || ((prVar46->hmm).score[0] < iVar20)))) {
                hmm_enter(&prVar46->hmm,iVar20,pbVar45[lVar43].path,iVar30);
                sVar3 = pdVar13->ldiph_lc[prVar46->ciphone][prVar46->ci2phone][pbVar45[lVar43].lc];
                (prVar46->hmm).senid[0] = sVar3;
                iVar47 = (int)local_460;
                if (sVar3 == 0xffff) {
                  __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x52e,"void word_transition(ngram_search_t *, int)");
                }
              }
              prVar46 = prVar46 + 1;
              iVar36 = iVar36 + -1;
            } while (1 < iVar36);
          }
          local_458 = (uint *)CONCAT44(local_458._4_4_,iVar30);
          iVar47 = ngs->n_1ph_LMwords;
          if (0 < (long)iVar47) {
            piVar32 = ngs->single_phone_wid;
            plVar8 = ngs->last_ltrans;
            lVar43 = 0;
            do {
              plVar8[piVar32[lVar43]].dscr = -0x80000000;
              lVar43 = lVar43 + 1;
            } while (iVar47 != lVar43);
          }
          lVar43 = (long)ngs->bp_table_idx[(long)puVar41];
          local_468 = puVar41;
          if (ngs->bp_table_idx[(long)puVar41] < ngs->bpidx) {
            do {
              if ((ngs->bp_table[lVar43].valid != '\0') && (0 < ngs->n_1ph_LMwords)) {
                pbVar34 = ngs->bp_table + lVar43;
                lVar40 = 0;
                do {
                  iVar47 = ngs->single_phone_wid[lVar40];
                  iVar19 = ngram_search_exit_score(ngs,pbVar34,(int)*pdVar12->word[iVar47].ciphone);
                  iVar30 = -0x20000000;
                  if (iVar19 != -0x20000000) {
                    iVar22 = ngram_tg_score(ngs->lmset,pdVar12->word[iVar47].basewid,
                                            pbVar34->real_wid,pbVar34->prev_real_wid,local_438);
                    iVar30 = (iVar22 >> 10) + iVar19;
                  }
                  plVar8 = ngs->last_ltrans;
                  if (plVar8[iVar47].dscr < iVar30) {
                    plVar8[iVar47].dscr = iVar30;
                    plVar8[iVar47].bp = (int32)lVar43;
                  }
                  lVar40 = lVar40 + 1;
                } while (lVar40 < ngs->n_1ph_LMwords);
              }
              lVar43 = lVar43 + 1;
            } while (lVar43 < ngs->bpidx);
          }
          iVar47 = (int)local_458;
          iVar30 = (int)local_460;
          if (0 < ngs->n_1ph_LMwords) {
            lVar43 = 0;
            do {
              iVar36 = ngs->single_phone_wid[lVar43];
              if (iVar36 != ((ngs->base).dict)->startwid) {
                pcVar38 = ngs->word_chan[iVar36];
                if (ppVar5 == (ps_search_t *)0x0) {
                  iVar25 = 0;
                }
                else {
                  iVar25 = *(int *)((long)&(ppVar5[1].acmod)->config +
                                   (long)(short)pcVar38->ciphone * 4);
                }
                iVar20 = ngs->pip + ngs->last_ltrans[iVar36].dscr;
                if (iVar30 < iVar25 + iVar20) {
                  pbVar34 = ngs->bp_table;
                  iVar36 = ngs->last_ltrans[iVar36].bp;
                  if (((pcVar38->hmm).frame < (int)local_468) || ((pcVar38->hmm).score[0] < iVar20))
                  {
                    hmm_enter(&pcVar38->hmm,iVar20,iVar36,iVar47);
                    iVar30 = pbVar34[iVar36].wid;
                    uVar4 = pdVar13->ldiph_lc[(short)pcVar38->ciphone]
                            [*(short *)((long)&pcVar38->ciphone + 2)]
                            [pdVar12->word[iVar30].ciphone[(long)pdVar12->word[iVar30].pronlen + -1]
                            ];
                    (pcVar38->hmm).senid[0] = uVar4;
                    iVar30 = (int)local_460;
                    if (uVar4 == 0xffff) {
                      __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                    ,0x56c,"void word_transition(ngram_search_t *, int)");
                    }
                  }
                }
              }
              lVar43 = lVar43 + 1;
            } while (lVar43 < ngs->n_1ph_LMwords);
          }
          iVar36 = ((ngs->base).acmod)->mdef->sil;
          pcVar38 = ngs->word_chan[(ngs->base).silence_wid];
          iVar25 = ngs->silpen + ngs->bestbp_rc[iVar36].score + ngs->pip;
          if (ppVar5 == (ps_search_t *)0x0) {
            iVar20 = 0;
          }
          else {
            iVar20 = *(int *)((long)&(ppVar5[1].acmod)->config + (long)(short)pcVar38->ciphone * 4);
          }
          pbVar45 = ngs->bestbp_rc + iVar36;
          iVar36 = (int)local_468;
          if ((iVar30 < iVar20 + iVar25) &&
             (((pcVar38->hmm).frame < iVar36 || ((pcVar38->hmm).score[0] < iVar25)))) {
            hmm_enter(&pcVar38->hmm,iVar25,pbVar45->path,iVar47);
            iVar30 = (int)local_460;
          }
          iVar25 = pdVar12->filler_start;
          if (iVar25 <= pdVar12->filler_end) {
            lVar43 = (long)iVar25 + -1;
            do {
              if (((iVar25 != (ngs->base).silence_wid) && (iVar25 != ((ngs->base).dict)->startwid))
                 && (pcVar38 = ngs->word_chan[lVar43 + 1], pcVar38 != (chan_t *)0x0)) {
                if (ppVar5 == (ps_search_t *)0x0) {
                  iVar20 = 0;
                }
                else {
                  iVar20 = *(int *)((long)&(ppVar5[1].acmod)->config +
                                   (long)(short)pcVar38->ciphone * 4);
                }
                score = ngs->fillpen + pbVar45->score + ngs->pip;
                if ((iVar30 < iVar20 + score) &&
                   (((pcVar38->hmm).frame < iVar36 || ((pcVar38->hmm).score[0] < score)))) {
                  hmm_enter(&pcVar38->hmm,score,pbVar45->path,iVar47);
                  iVar30 = (int)local_460;
                }
              }
              lVar43 = lVar43 + 1;
              iVar25 = iVar25 + 1;
            } while (lVar43 < pdVar12->filler_end);
          }
        }
      }
      uVar42 = local_46c;
      if (0 < ngs->n_root_chan) {
        prVar46 = ngs->root_chan;
        iVar47 = ngs->n_root_chan + 1;
        do {
          if ((prVar46->hmm).frame == uVar42) {
            hmm_clear(&prVar46->hmm);
          }
          prVar46 = prVar46 + 1;
          iVar47 = iVar47 + -1;
        } while (1 < iVar47);
      }
      if (0 < ngs->n_1ph_words) {
        lVar43 = 0;
        do {
          if ((ngs->word_chan[ngs->single_phone_wid[lVar43]]->hmm).frame == uVar42) {
            hmm_clear(&ngs->word_chan[ngs->single_phone_wid[lVar43]]->hmm);
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 < ngs->n_1ph_words);
      }
      ngs->n_frame = ngs->n_frame + 1;
      iVar47 = 1;
    }
  }
  return iVar47;
}

Assistant:

int
ngram_fwdtree_search(ngram_search_t *ngs, int frame_idx)
{
    int16 const *senscr;

    /* Activate our HMMs for the current frame if need be. */
    if (!ps_search_acmod(ngs)->compallsen)
        compute_sen_active(ngs, frame_idx);

    /* Compute GMM scores for the current frame. */
    if ((senscr = acmod_score(ps_search_acmod(ngs), &frame_idx)) == NULL)
        return 0;
    ngs->st.n_senone_active_utt += ps_search_acmod(ngs)->n_senone_active;

    /* Mark backpointer table for current frame. */
    ngram_search_mark_bptable(ngs, frame_idx);

    /* If the best score is equal to or worse than WORST_SCORE,
     * recognition has failed, don't bother to keep trying. */
    if (ngs->best_score == WORST_SCORE || ngs->best_score WORSE_THAN WORST_SCORE)
        return 0;
    /* Renormalize if necessary */
    if (ngs->best_score + (2 * ngs->beam) WORSE_THAN WORST_SCORE) {
        E_INFO("Renormalizing Scores at frame %d, best score %d\n",
               frame_idx, ngs->best_score);
        renormalize_scores(ngs, frame_idx, ngs->best_score);
    }

    /* Evaluate HMMs */
    evaluate_channels(ngs, senscr, frame_idx);
    /* Prune HMMs and do phone transitions. */
    prune_channels(ngs, frame_idx);
    /* Do absolute pruning on word exits. */
    bptable_maxwpf(ngs, frame_idx);
    /* Do word transitions. */
    word_transition(ngs, frame_idx);
    /* Deactivate pruned HMMs. */
    deactivate_channels(ngs, frame_idx);

    ++ngs->n_frame;
    /* Return the number of frames processed. */
    return 1;
}